

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O0

bool __thiscall arm::Operand2::operator==(Operand2 *this,Operand2 *other)

{
  bool bVar1;
  variant<arm::RegisterOperand,_int> other_;
  variant<arm::RegisterOperand,_int> this_;
  variant<arm::RegisterOperand,_int> *in_stack_ffffffffffffffb8;
  variant<arm::RegisterOperand,_int> *in_stack_ffffffffffffffc0;
  variant<arm::RegisterOperand,_int> *in_stack_ffffffffffffffc8;
  variant<arm::RegisterOperand,_int> *in_stack_ffffffffffffffd0;
  
  std::variant<arm::RegisterOperand,_int>::variant
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::variant<arm::RegisterOperand,_int>::variant
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return bVar1;
}

Assistant:

bool operator==(const Operand2& other) const {
    auto this_ =
        dynamic_cast<const std::variant<RegisterOperand, int32_t>&>(*this);
    auto other_ =
        dynamic_cast<const std::variant<RegisterOperand, int32_t>&>(other);
    return this_ == other_;
  }